

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O1

bool __thiscall
axl::zip::ZipReader::extractFileToMem(ZipReader *this,size_t index,void *p,size_t size)

{
  mz_bool mVar1;
  char readBuffer [1024];
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_448;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_430;
  undefined1 local_418 [1032];
  
  mVar1 = mz_zip_reader_extract_to_mem_no_alloc(this->m_zip,(mz_uint)index,p,size,0,local_418,0x400)
  ;
  if (mVar1 == 0) {
    err::Error::Error((Error *)&local_430,5);
    local_448.m_p = (ErrorHdr *)0x0;
    local_448.m_hdr = (BufHdr *)0x0;
    local_448.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_448,&local_430);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_430);
    err::setError((ErrorRef *)&local_448);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_448);
  }
  return mVar1 != 0;
}

Assistant:

bool
ZipReader::extractFileToMem(
	size_t index,
	void* p,
	size_t size
) const {
	ASSERT(isOpen());

	char readBuffer[1024];
	mz_bool result = mz_zip_reader_extract_to_mem_no_alloc(
		m_zip,
		index,
		p,
		size,
		0,
		readBuffer,
		sizeof(readBuffer)
	);

	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}